

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser_error parse_renderer_name(parser *p)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t local_34;
  renderer_info *local_30;
  renderer_info *renderer;
  wchar_t ind;
  char *name;
  parser *p_local;
  
  pcVar2 = parser_getstr(p,"name");
  wVar1 = ui_entry_renderer_lookup(pcVar2);
  if (wVar1 == L'\0') {
    if (renderer_allocated <= renderer_count) {
      if (L'\x3fffffff' < renderer_allocated) {
        return PARSE_ERROR_TOO_MANY_ENTRIES;
      }
      if (renderer_allocated == L'\0') {
        local_34 = L'\x04';
      }
      else {
        local_34 = renderer_allocated << 1;
      }
      renderer_allocated = local_34;
      renderers = (renderer_info *)mem_realloc(renderers,(long)local_34 * 0x58);
    }
    local_30 = renderers + renderer_count;
    renderer_count = renderer_count + L'\x01';
    pcVar2 = string_make(pcVar2);
    local_30->name = pcVar2;
    local_30->comb_rend_nm = (char *)0x0;
    local_30->colors = (int *)0x0;
    local_30->label_colors = (int *)0x0;
    local_30->symbols = (wchar_t *)0x0;
    local_30->units_label = (wchar_t *)0x0;
    local_30->backend = (backend_info *)0x0;
    local_30->combined_renderer_index = L'\0';
    local_30->combiner_index = L'\0';
    local_30->ncolors = L'\0';
    local_30->nlabcolors = L'\0';
    local_30->nsym = L'\0';
    local_30->ndigit = L'\x80000000';
    local_30->sign = L'\x80000000';
    local_30->units_nlabel = L'\0';
  }
  else {
    local_30 = renderers + (long)wVar1 + -1;
  }
  parser_setpriv(p,local_30);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_renderer_name(struct parser *p)
{
	const char *name = parser_getstr(p, "name");
	int ind = ui_entry_renderer_lookup(name);
	struct renderer_info *renderer;

	if (ind == 0) {
		if (renderer_count >= renderer_allocated) {
			if (renderer_allocated > INT_MAX / 2) {
				return PARSE_ERROR_TOO_MANY_ENTRIES;
			}
			renderer_allocated = (renderer_allocated == 0) ?
				4 : renderer_allocated * 2;
			renderers = mem_realloc(renderers,
				renderer_allocated * sizeof(*renderers));
		}
		renderer = renderers + renderer_count;
		++renderer_count;
		renderer->name = string_make(name);
		renderer->comb_rend_nm = NULL;
		renderer->colors = NULL;
		renderer->label_colors = NULL;
		renderer->symbols = NULL;
		renderer->units_label = NULL;
		renderer->backend = NULL;
		renderer->combined_renderer_index = 0;
		renderer->combiner_index = 0;
		renderer->ncolors = 0;
		renderer->nlabcolors = 0;
		renderer->nsym = 0;
		renderer->ndigit = INT_MIN;
		renderer->sign = UI_ENTRY_SIGN_DEFAULT;
		renderer->units_nlabel = 0;
	} else {
		renderer = renderers + ind - 1;
	}
	parser_setpriv(p, renderer);
	return PARSE_ERROR_NONE;
}